

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-knowledge.c
# Opt level: O2

void player_learn_rune(player *p,size_t i,_Bool message)

{
  byte bVar1;
  _Bool *p_Var2;
  curse_data *pcVar3;
  brand_conflict *pbVar4;
  rune *prVar5;
  _Bool _Var6;
  bool bVar7;
  int iVar8;
  char *pcVar9;
  char **ppcVar10;
  wchar_t j;
  ulong uVar11;
  
  prVar5 = rune_list;
  switch(rune_list[i].variety) {
  case RUNE_VAR_COMBAT:
    iVar8 = rune_list[i].index;
    if (iVar8 == 2) {
      if (p->obj_k->to_d != 0) {
        return;
      }
      p->obj_k->to_d = 1;
    }
    else if (iVar8 == 1) {
      if (p->obj_k->to_h != 0) {
        return;
      }
      p->obj_k->to_h = 1;
    }
    else {
      if (iVar8 != 0) {
        return;
      }
      if (p->obj_k->to_a != 0) {
        return;
      }
      p->obj_k->to_a = 1;
    }
    break;
  case RUNE_VAR_MOD:
    if (p->obj_k->modifiers[rune_list[i].index] != 0) {
      return;
    }
    p->obj_k->modifiers[rune_list[i].index] = 1;
    break;
  case RUNE_VAR_RESIST:
    if (p->obj_k->el_info[rune_list[i].index].res_level != 0) {
      return;
    }
    p->obj_k->el_info[rune_list[i].index].res_level = 1;
    break;
  case RUNE_VAR_BRAND:
    iVar8 = rune_list[i].index;
    bVar1 = z_info->brand_max;
    if ((int)(uint)bVar1 <= iVar8) {
      __assert_fail("r->index < z_info->brand_max",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/timschumi[P]angband/src/obj-knowledge.c"
                    ,0x4f6,"void player_learn_rune(struct player *, size_t, _Bool)");
    }
    p_Var2 = p->obj_k->brands;
    if (p_Var2[iVar8] != false) {
      return;
    }
    pbVar4 = brands + iVar8;
    ppcVar10 = &brands[1].name;
    bVar7 = false;
    for (uVar11 = 1; uVar11 < bVar1; uVar11 = uVar11 + 1) {
      iVar8 = strcmp(pbVar4->name,*ppcVar10);
      if (iVar8 == 0) {
        p_Var2[uVar11] = true;
        bVar7 = true;
      }
      ppcVar10 = ppcVar10 + 7;
    }
    goto joined_r0x0018311c;
  case RUNE_VAR_SLAY:
    bVar1 = z_info->slay_max;
    if ((int)(uint)bVar1 <= rune_list[i].index) {
      __assert_fail("r->index < z_info->slay_max",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/timschumi[P]angband/src/obj-knowledge.c"
                    ,0x507,"void player_learn_rune(struct player *, size_t, _Bool)");
    }
    if (p->obj_k->slays[rune_list[i].index] != false) {
      return;
    }
    bVar7 = false;
    for (uVar11 = 1; uVar11 < bVar1; uVar11 = uVar11 + 1) {
      _Var6 = same_monsters_slain(prVar5[i].index,(wchar_t)uVar11);
      if (_Var6) {
        p->obj_k->slays[uVar11] = true;
        bVar7 = true;
      }
      bVar1 = z_info->slay_max;
    }
    goto joined_r0x0018311c;
  case RUNE_VAR_CURSE:
    iVar8 = rune_list[i].index;
    if ((int)(uint)z_info->curse_max <= iVar8) {
      __assert_fail("j < z_info->curse_max",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/timschumi[P]angband/src/obj-knowledge.c"
                    ,0x51a,"void player_learn_rune(struct player *, size_t, _Bool)");
    }
    pcVar3 = p->obj_k->curses;
    if (pcVar3[iVar8].power == L'\x01') {
      return;
    }
    pcVar3[iVar8].power = L'\x01';
    break;
  case RUNE_VAR_FLAG:
    bVar7 = flag_on_dbg(p->obj_k->flags,5,rune_list[i].index,"p->obj_k->flags","r->index");
joined_r0x0018311c:
    if (!bVar7) {
switchD_00182f27_default:
      return;
    }
    break;
  default:
    goto switchD_00182f27_default;
  }
  if (message) {
    pcVar9 = rune_name(i);
    msgt(0x80,"You have learned the rune of %s.",pcVar9);
  }
  update_player_object_knowledge(p);
  return;
}

Assistant:

static void player_learn_rune(struct player *p, size_t i, bool message)
{
	struct rune *r = &rune_list[i];
	bool learned = false;

	switch (r->variety) {
		/* Combat runes */
		case RUNE_VAR_COMBAT: {
			if (r->index == COMBAT_RUNE_TO_A) {
				if (!p->obj_k->to_a) {
					p->obj_k->to_a = 1;
					learned = true;
				}
			} else if (r->index == COMBAT_RUNE_TO_H) {
				if (!p->obj_k->to_h) {
					p->obj_k->to_h = 1;
					learned = true;
				}
			} else if (r->index == COMBAT_RUNE_TO_D) {
				if (!p->obj_k->to_d) {
					p->obj_k->to_d = 1;
					learned = true;
				}
			}
			break;
		}
		/* Mod runes */
		case RUNE_VAR_MOD: {
			if (!p->obj_k->modifiers[r->index]) {
				p->obj_k->modifiers[r->index] = 1;
				learned = true;
			}
			break;
		}
		/* Element runes */
		case RUNE_VAR_RESIST: {
			if (!p->obj_k->el_info[r->index].res_level) {
				p->obj_k->el_info[r->index].res_level = 1;
				learned = true;
			}
			break;
		}
		/* Brand runes */
		case RUNE_VAR_BRAND: {
			assert(r->index < z_info->brand_max);

			/* If the brand was unknown, add it to known brands */
			if (!player_knows_brand(p, r->index)) {
				int j;
				for (j = 1; j < z_info->brand_max; j++) {
					/* Check base and race flag */
					if (streq(brands[r->index].name, brands[j].name)) {
						p->obj_k->brands[j] = true;
						learned = true;
					}
				}
			}
			break;
		}
		/* Slay runes */
		case RUNE_VAR_SLAY: {
			assert(r->index < z_info->slay_max);

			/* If the slay was unknown, add it to known slays */
			if (!player_knows_slay(p, r->index)) {
				int j;
				for (j = 1; j < z_info->slay_max; j++) {
					/* Check base and race flag */
					if (same_monsters_slain(r->index, j)) {
						p->obj_k->slays[j] = true;
						learned = true;
					}
				}
			}
			break;
		}

		/* Curse runes */
		case RUNE_VAR_CURSE: {
			int j = r->index;
			assert(j < z_info->curse_max);

			/* If the curse was unknown, add it to known curses */
			if (!player_knows_curse(p, j)) {
				p->obj_k->curses[j].power = 1;
				learned = true;
			}
			break;
		}
		/* Flag runes */
		case RUNE_VAR_FLAG: {
			if (of_on(p->obj_k->flags, r->index))
				learned = true;
			break;
		}
		default: {
			learned = false;
			break;
		}
	}

	/* Nothing learned */
	if (!learned) return;

	/* Give a message */
	if (message)
		msgt(MSG_RUNE, "You have learned the rune of %s.", rune_name(i));

	/* Update knowledge */
	update_player_object_knowledge(p);
}